

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextimagehandler.cpp
# Opt level: O3

QUrl findAtNxFileOrResource
               (QString *baseFileName,qreal targetDevicePixelRatio,qreal *sourceDevicePixelRatio,
               QString *name)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  Data *pDVar5;
  char cVar6;
  char cVar7;
  QString *in_RCX;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QUrl url;
  QStringBuilder<QLatin1String,_QString_&> local_90;
  QString local_78;
  QUrl local_60;
  QString local_58;
  QUrlPrivate *local_38;
  
  local_38 = *(QUrlPrivate **)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_60.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_60,(QString *)sourceDevicePixelRatio,TolerantMode);
  cVar6 = QUrl::isLocalFile();
  if (cVar6 == '\0') {
    QVar8.m_data = &DAT_00000005;
    QVar8.m_size = (qsizetype)sourceDevicePixelRatio;
    cVar7 = QString::startsWith(QVar8,0x6af88b);
    if (cVar7 == '\0') {
      QString::operator=(&local_58,(QString *)sourceDevicePixelRatio);
      QVar9.m_data = (char *)0x2;
      QVar9.m_size = (qsizetype)sourceDevicePixelRatio;
      cVar7 = QString::startsWith(QVar9,0x6af88e);
    }
    else {
      QString::QString(&local_78,(QChar *)((long)sourceDevicePixelRatio[1] + 6),
                       (long)sourceDevicePixelRatio[2] + -3);
      pcVar2 = local_58.d.ptr;
      pDVar5 = local_58.d.d;
      qVar3 = local_78.d.size;
      pDVar4 = local_78.d.d;
      local_78.d.d = local_58.d.d;
      local_58.d.d = pDVar4;
      local_58.d.ptr = local_78.d.ptr;
      local_78.d.ptr = pcVar2;
      local_78.d.size = local_58.d.size;
      local_58.d.size = qVar3;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      cVar7 = '\x01';
    }
  }
  else {
    QUrl::toLocalFile();
    pcVar2 = local_58.d.ptr;
    pDVar5 = local_58.d.d;
    qVar3 = local_78.d.size;
    pDVar4 = local_78.d.d;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar4;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.ptr = pcVar2;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar3;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    cVar7 = '\0';
  }
  qt_findAtNxFile(&local_78,&local_58,targetDevicePixelRatio,(qreal *)name);
  pQVar1 = *(QArrayData **)in_RCX;
  pcVar2 = *(char16_t **)(in_RCX + 8);
  *(Data **)in_RCX = local_78.d.d;
  *(char16_t **)(in_RCX + 8) = local_78.d.ptr;
  qVar3 = *(qsizetype *)(in_RCX + 0x10);
  *(qsizetype *)(in_RCX + 0x10) = local_78.d.size;
  local_78.d.d = (Data *)pQVar1;
  local_78.d.ptr = pcVar2;
  local_78.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (cVar6 == '\0') {
    if (cVar7 == '\0') {
      QUrl::QUrl((QUrl *)baseFileName,in_RCX,TolerantMode);
    }
    else {
      local_90.a.m_size = 3;
      local_90.a.m_data = "qrc";
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>(&local_78,&local_90);
      QUrl::QUrl((QUrl *)baseFileName,(QString *)&local_78,TolerantMode);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else {
    QUrl::fromLocalFile((QString *)baseFileName);
  }
  QUrl::~QUrl(&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QUrlPrivate **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)*(QUrlPrivate **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static inline QUrl findAtNxFileOrResource(const QString &baseFileName,
                                          qreal targetDevicePixelRatio,
                                          qreal *sourceDevicePixelRatio,
                                          QString *name)
{
    // qt_findAtNxFile expects a file name that can be tested with QFile::exists.
    // so if the format.name() is a file:/ or qrc:/ URL, then we need to strip away the schema.
    QString localFile;
    const QUrl url(baseFileName);
    bool hasFileScheme = false;
    bool isResource = false;
    if (url.isLocalFile()) {
        localFile = url.toLocalFile();
        hasFileScheme = true;
    } else if (baseFileName.startsWith("qrc:/"_L1)) {
        // QFile::exists() can only handle ":/file.txt"
        localFile = baseFileName.sliced(3);
        isResource = true;
    } else {
        localFile = baseFileName;
        isResource = baseFileName.startsWith(":/"_L1);
    }
    *name = qt_findAtNxFile(localFile, targetDevicePixelRatio, sourceDevicePixelRatio);

    if (hasFileScheme)
        return QUrl::fromLocalFile(*name);
    if (isResource)
        return QUrl("qrc"_L1 + *name);
    return QUrl(*name);
}